

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

secp256k1_context * secp256k1_context_preallocated_clone(secp256k1_context *ctx,void *prealloc)

{
  int iVar1;
  secp256k1_context *in_RSI;
  void *in_RDI;
  secp256k1_context *ret;
  char *in_stack_ffffffffffffffd8;
  secp256k1_callback *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  if (in_RSI == (secp256k1_context *)0x0) {
    secp256k1_callback_call(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    local_8 = (secp256k1_context *)0x0;
  }
  else {
    iVar1 = secp256k1_context_is_proper((secp256k1_context *)0x1015f9);
    if (iVar1 == 0) {
      secp256k1_callback_call(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      local_8 = (secp256k1_context *)0x0;
    }
    else {
      memcpy(in_RSI,in_RDI,0xd0);
      local_8 = in_RSI;
    }
  }
  return local_8;
}

Assistant:

secp256k1_context* secp256k1_context_preallocated_clone(const secp256k1_context* ctx, void* prealloc) {
    secp256k1_context* ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(prealloc != NULL);
    ARG_CHECK(secp256k1_context_is_proper(ctx));

    ret = (secp256k1_context*)prealloc;
    *ret = *ctx;
    return ret;
}